

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O2

void pystring::os::path::split_posix(string *head,string *tail,string *p)

{
  bool bVar1;
  int iVar2;
  string sStack_48;
  
  iVar2 = rfind(p,(string *)forward_slash_abi_cxx11_,0,0x7fffffff);
  slice(&sStack_48,p,0,iVar2 + 1);
  std::__cxx11::string::operator=((string *)head,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  slice(&sStack_48,p,iVar2 + 1,0x7fffffff);
  std::__cxx11::string::operator=((string *)tail,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  if (head->_M_string_length != 0) {
    mul(&sStack_48,(string *)forward_slash_abi_cxx11_,(int)head->_M_string_length);
    bVar1 = std::operator!=(head,&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    if (bVar1) {
      rstrip(&sStack_48,head,(string *)forward_slash_abi_cxx11_);
      std::__cxx11::string::operator=((string *)head,(string *)&sStack_48);
      std::__cxx11::string::~string((string *)&sStack_48);
    }
  }
  return;
}

Assistant:

void split_posix(std::string & head, std::string & tail, const std::string & p)
    {
        int i = pystring::rfind(p, forward_slash) + 1;
        
        head = pystring::slice(p,0,i);
        tail = pystring::slice(p,i);
        
        if(!head.empty() && (head != pystring::mul(forward_slash, (int) head.size())))
        {
            head = pystring::rstrip(head, forward_slash);
        }
    }